

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_stats.cpp
# Opt level: O2

void duckdb::StringStats::Verify
               (BaseStatistics *stats,Vector *vector,SelectionVector *sel,idx_t count)

{
  uint *puVar1;
  UnicodeType UVar2;
  int iVar3;
  ulong uVar4;
  InternalException *pIVar5;
  char *data;
  ulong uVar6;
  allocator local_1e9;
  ulong local_1e8;
  Vector *local_1e0;
  string local_1d8;
  string_t value;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  UnifiedVectorFormat vdata;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
  local_1e8 = count;
  local_1e0 = vector;
  Vector::ToUnifiedFormat(vector,count,&vdata);
  uVar6 = 0;
  do {
    if (local_1e8 == uVar6) {
      UnifiedVectorFormat::~UnifiedVectorFormat(&vdata);
      return;
    }
    uVar4 = uVar6;
    if (sel->sel_vector != (sel_t *)0x0) {
      uVar4 = (ulong)sel->sel_vector[uVar6];
    }
    if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
      uVar4 = (ulong)(vdata.sel)->sel_vector[uVar4];
    }
    if ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar4 >> 6] >>
         (uVar4 & 0x3f) & 1) != 0)) {
      puVar1 = (uint *)(vdata.data + uVar4 * 0x10);
      value.value.pointer.length = *puVar1;
      value.value.pointer.prefix = *(char (*) [4])(puVar1 + 1);
      value.value._8_4_ = puVar1[2];
      value.value._12_4_ = puVar1[3];
      uVar4 = (ulong)value.value.pointer.length;
      data = value.value.pointer.prefix;
      if (0xc < uVar4) {
        data = *(char **)(puVar1 + 2);
      }
      if (((stats->stats_union).string_data.has_max_string_length == true) &&
         ((stats->stats_union).string_data.max_string_length < value.value.pointer.length)) {
        pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_1d8,
                   "Statistics mismatch: string value exceeds maximum string length.\nStatistics: %s\nVector: %s"
                   ,&local_1e9);
        BaseStatistics::ToString_abi_cxx11_(&local_98,stats);
        Vector::ToString_abi_cxx11_(&local_b8,local_1e0,local_1e8);
        InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                  (pIVar5,&local_1d8,&local_98,&local_b8);
        __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (((stats->type).id_ == VARCHAR) && ((stats->stats_union).string_data.has_unicode == false))
      {
        UVar2 = Utf8Proc::Analyze(data,uVar4,(UnicodeInvalidReason *)0x0,(size_t *)0x0);
        if (UVar2 == INVALID) {
          pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_1d8,"Invalid unicode detected in vector: %s",&local_1e9);
          Vector::ToString_abi_cxx11_(&local_118,local_1e0,local_1e8);
          InternalException::InternalException<std::__cxx11::string>(pIVar5,&local_1d8,&local_118);
          __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (UVar2 == UNICODE) {
          pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_1d8,
                     "Statistics mismatch: string value contains unicode, but statistics says it shouldn\'t.\nStatistics: %s\nVector: %s"
                     ,&local_1e9);
          BaseStatistics::ToString_abi_cxx11_(&local_d8,stats);
          Vector::ToString_abi_cxx11_(&local_f8,local_1e0,local_1e8);
          InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                    (pIVar5,&local_1d8,&local_d8,&local_f8);
          __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      if (7 < uVar4) {
        uVar4 = 8;
      }
      iVar3 = StringValueComparison
                        ((const_data_ptr_t)data,uVar4,(const_data_ptr_t)&stats->stats_union);
      if (iVar3 < 0) {
        pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_1d8,
                   "Statistics mismatch: value is smaller than min.\nStatistics: %s\nVector: %s",
                   &local_1e9);
        BaseStatistics::ToString_abi_cxx11_(&local_138,stats);
        Vector::ToString_abi_cxx11_(&local_158,local_1e0,local_1e8);
        InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                  (pIVar5,&local_1d8,&local_138,&local_158);
        __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      iVar3 = StringValueComparison
                        ((const_data_ptr_t)data,uVar4,(stats->stats_union).string_data.max);
      if (0 < iVar3) {
        pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_1d8,
                   "Statistics mismatch: value is bigger than max.\nStatistics: %s\nVector: %s",
                   &local_1e9);
        BaseStatistics::ToString_abi_cxx11_(&local_178,stats);
        Vector::ToString_abi_cxx11_(&local_198,local_1e0,local_1e8);
        InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                  (pIVar5,&local_1d8,&local_178,&local_198);
        __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void StringStats::Verify(const BaseStatistics &stats, Vector &vector, const SelectionVector &sel, idx_t count) {
	auto &string_data = StringStats::GetDataUnsafe(stats);

	UnifiedVectorFormat vdata;
	vector.ToUnifiedFormat(count, vdata);
	auto data = UnifiedVectorFormat::GetData<string_t>(vdata);
	for (idx_t i = 0; i < count; i++) {
		auto idx = sel.get_index(i);
		auto index = vdata.sel->get_index(idx);
		if (!vdata.validity.RowIsValid(index)) {
			continue;
		}
		auto value = data[index];
		auto data = value.GetData();
		auto len = value.GetSize();
		// LCOV_EXCL_START
		if (string_data.has_max_string_length && len > string_data.max_string_length) {
			throw InternalException(
			    "Statistics mismatch: string value exceeds maximum string length.\nStatistics: %s\nVector: %s",
			    stats.ToString(), vector.ToString(count));
		}
		if (stats.GetType().id() == LogicalTypeId::VARCHAR && !string_data.has_unicode) {
			auto unicode = Utf8Proc::Analyze(data, len);
			if (unicode == UnicodeType::UNICODE) {
				throw InternalException("Statistics mismatch: string value contains unicode, but statistics says it "
				                        "shouldn't.\nStatistics: %s\nVector: %s",
				                        stats.ToString(), vector.ToString(count));
			} else if (unicode == UnicodeType::INVALID) {
				throw InternalException("Invalid unicode detected in vector: %s", vector.ToString(count));
			}
		}
		if (StringValueComparison(const_data_ptr_cast(data),
		                          MinValue<idx_t>(len, StringStatsData::MAX_STRING_MINMAX_SIZE), string_data.min) < 0) {
			throw InternalException("Statistics mismatch: value is smaller than min.\nStatistics: %s\nVector: %s",
			                        stats.ToString(), vector.ToString(count));
		}
		if (StringValueComparison(const_data_ptr_cast(data),
		                          MinValue<idx_t>(len, StringStatsData::MAX_STRING_MINMAX_SIZE), string_data.max) > 0) {
			throw InternalException("Statistics mismatch: value is bigger than max.\nStatistics: %s\nVector: %s",
			                        stats.ToString(), vector.ToString(count));
		}
		// LCOV_EXCL_STOP
	}
}